

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

Option<Catch::AssertionResult> * __thiscall
Catch::Option<Catch::AssertionResult>::operator=
          (Option<Catch::AssertionResult> *this,AssertionResult *_value)

{
  pointer pcVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  size_type sVar10;
  size_t sVar11;
  size_type sVar12;
  
  reset(this);
  *(undefined8 *)(this->storage + 0x30) = *(undefined8 *)&(_value->m_info).resultDisposition;
  uVar2 = *(undefined4 *)&(_value->m_info).macroName.m_start;
  uVar3 = *(undefined4 *)((long)&(_value->m_info).macroName.m_start + 4);
  sVar10 = (_value->m_info).macroName.m_size;
  uVar4 = *(undefined4 *)((long)&(_value->m_info).macroName.m_size + 4);
  uVar5 = *(undefined4 *)&(_value->m_info).lineInfo.file;
  uVar6 = *(undefined4 *)((long)&(_value->m_info).lineInfo.file + 4);
  sVar11 = (_value->m_info).lineInfo.line;
  uVar7 = *(undefined4 *)((long)&(_value->m_info).lineInfo.line + 4);
  uVar8 = *(undefined4 *)((long)&(_value->m_info).capturedExpression.m_start + 4);
  sVar12 = (_value->m_info).capturedExpression.m_size;
  uVar9 = *(undefined4 *)((long)&(_value->m_info).capturedExpression.m_size + 4);
  *(undefined4 *)(this->storage + 0x20) =
       *(undefined4 *)&(_value->m_info).capturedExpression.m_start;
  *(undefined4 *)(this->storage + 0x24) = uVar8;
  *(int *)(this->storage + 0x28) = (int)sVar12;
  *(undefined4 *)(this->storage + 0x2c) = uVar9;
  *(undefined4 *)(this->storage + 0x10) = uVar5;
  *(undefined4 *)(this->storage + 0x14) = uVar6;
  *(int *)(this->storage + 0x18) = (int)sVar11;
  *(undefined4 *)(this->storage + 0x1c) = uVar7;
  *(undefined4 *)this->storage = uVar2;
  *(undefined4 *)(this->storage + 4) = uVar3;
  *(int *)(this->storage + 8) = (int)sVar10;
  *(undefined4 *)(this->storage + 0xc) = uVar4;
  *(char **)(this->storage + 0x38) = this->storage + 0x48;
  pcVar1 = (_value->m_resultData).message._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(this->storage + 0x38),pcVar1,
             pcVar1 + (_value->m_resultData).message._M_string_length);
  *(char **)(this->storage + 0x58) = this->storage + 0x68;
  pcVar1 = (_value->m_resultData).reconstructedExpression._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(this->storage + 0x58),pcVar1,
             pcVar1 + (_value->m_resultData).reconstructedExpression._M_string_length);
  this->storage[0x78] = '\0';
  this->storage[0x79] = '\0';
  this->storage[0x7a] = '\0';
  this->storage[0x7b] = '\0';
  this->storage[0x7c] = '\0';
  this->storage[0x7d] = '\0';
  this->storage[0x7e] = '\0';
  this->storage[0x7f] = '\0';
  this->storage[0x80] = (_value->m_resultData).lazyExpression.m_isNegated;
  *(OfType *)(this->storage + 0x88) = (_value->m_resultData).resultType;
  this->nullableValue = (AssertionResult *)this->storage;
  return this;
}

Assistant:

Option& operator = ( T const& _value ) {
            reset();
            nullableValue = new( storage ) T( _value );
            return *this;
        }